

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookupTable.h
# Opt level: O1

IDTy __thiscall dg::PointerIDLookupTable::get(PointerIDLookupTable *this,Pointer *ptr)

{
  ulong __code;
  __node_base_ptr p_Var1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  
  p_Var3 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::pta::PSNode_*>,_std::hash<dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::pta::PSNode_*>,_std::hash<dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)this,(ulong)ptr->target %
                              *(ulong *)&(this->_ptrToID).
                                         super_HashMapImpl<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::unordered_map<dg::pta::PSNode_*,_dg::STLHashMap<dg::Offset,_unsigned_long>,_std::hash<dg::pta::PSNode_*>,_std::equal_to<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::STLHashMap<dg::Offset,_unsigned_long>_>_>_>_>
                                         .field_0x8,&ptr->target,(__hash_code)ptr->target);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var3 = p_Var1->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    __code = (ptr->offset).offset;
    p_Var4 = (_Hash_node_base *)0x0;
    p_Var2 = std::
             _Hashtable<dg::Offset,_std::pair<const_dg::Offset,_unsigned_long>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<dg::Offset>,_std::hash<dg::Offset>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<dg::Offset,_std::pair<const_dg::Offset,_unsigned_long>,_std::allocator<std::pair<const_dg::Offset,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<dg::Offset>,_std::hash<dg::Offset>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(p_Var3 + 2),__code % (ulong)p_Var3[3]._M_nxt,&ptr->offset,__code);
    if (p_Var2 != (__node_base_ptr)0x0) {
      p_Var4 = p_Var2->_M_nxt;
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      return (IDTy)p_Var4[2]._M_nxt;
    }
  }
  return 0;
}

Assistant:

IDTy get(const Pointer &ptr) const {
        auto it = _ptrToID.find(ptr.target);
        if (it == _ptrToID.end()) {
            return 0; // invalid ID
        }
        auto it2 = it->second.find(ptr.offset);
        if (it2 == it->second.end())
            return 0;
        return it2->second;
    }